

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O2

int lj_cf_jit_util_funcbc(lua_State *L)

{
  uint uVar1;
  GCproto *pGVar2;
  int iVar3;
  
  pGVar2 = check_Lproto(L,0);
  uVar1 = lj_lib_checkint(L,2);
  iVar3 = 0;
  if (uVar1 < pGVar2->sizebc) {
    uVar1 = (&pGVar2[1].nextgc)[uVar1].gcptr32;
    L->top->n = (double)(int)uVar1;
    L->top[1].n = (double)lj_bc_mode[uVar1 & 0xff];
    L->top = L->top + 2;
    iVar3 = 2;
  }
  return iVar3;
}

Assistant:

LJLIB_CF(jit_util_funcbc)
{
  GCproto *pt = check_Lproto(L, 0);
  BCPos pc = (BCPos)lj_lib_checkint(L, 2);
  if (pc < pt->sizebc) {
    BCIns ins = proto_bc(pt)[pc];
    BCOp op = bc_op(ins);
    lj_assertL(op < BC__MAX, "bad bytecode op %d", op);
    setintV(L->top, ins);
    setintV(L->top+1, lj_bc_mode[op]);
    L->top += 2;
    return 2;
  }
  return 0;
}